

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall
Json::StyledStreamWriter::StyledStreamWriter(StyledStreamWriter *this,string *indentation)

{
  string *in_RSI;
  long in_RDI;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x16e4ba);
  *(undefined8 *)(in_RDI + 0x18) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x20));
  *(undefined4 *)(in_RDI + 0x40) = 0x4a;
  std::__cxx11::string::string((string *)(in_RDI + 0x48),in_RSI);
  *(byte *)(in_RDI + 0x68) = *(byte *)(in_RDI + 0x68) & 0xfe;
  return;
}

Assistant:

StyledStreamWriter::StyledStreamWriter(std::string indentation)
    : document_(NULL), rightMargin_(74), indentation_(indentation),
      addChildValues_() {}